

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_test.cpp
# Opt level: O0

void __thiscall sign_verifycase::_impl<picnic_params_t>(sign_verifycase *this,anon_enum_32 *param)

{
  bool bVar1;
  int iVar2;
  value_expr<bool> *this_00;
  size_type sVar3;
  uchar *puVar4;
  pointer pvVar5;
  lazy_ostream *this_01;
  undefined4 *in_RSI;
  size_t siglen;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  picnic_publickey_t public_key;
  picnic_privatekey_t private_key;
  array<unsigned_char,_32UL> m;
  size_t max_signature_size;
  context_frame context_frame_250;
  array<unsigned_char,_32UL> *in_stack_00000c20;
  lazy_ostream *in_stack_fffffffffffff858;
  basic_cstring<const_char> *in_stack_fffffffffffff860;
  undefined7 in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff86f;
  size_type in_stack_fffffffffffff878;
  array<unsigned_char,_32UL> *this_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff880;
  const_string *in_stack_fffffffffffff898;
  const_string *msg;
  undefined7 in_stack_fffffffffffff8a0;
  undefined1 in_stack_fffffffffffff8a7;
  lazy_ostream *in_stack_fffffffffffff8a8;
  unit_test_log_t *in_stack_fffffffffffff8b0;
  const_string *this_03;
  undefined8 in_stack_fffffffffffff8e0;
  array<unsigned_char,_32UL> *this_04;
  value_expr<const_unsigned_long_&> *in_stack_fffffffffffff8e8;
  assertion_result local_600;
  basic_cstring<const_char> local_5d8;
  basic_cstring<const_char> local_5c8;
  basic_cstring<const_char> local_5b8;
  lazy_ostream local_5a8;
  undefined1 in_stack_fffffffffffffa77;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  *in_stack_fffffffffffffa78;
  assertion_result local_568;
  basic_cstring<const_char> local_540;
  basic_cstring<const_char> local_530;
  basic_cstring<const_char> local_520;
  lazy_ostream local_510 [2];
  undefined4 local_4f0;
  assertion_result local_4d0;
  basic_cstring<const_char> local_4a8;
  basic_cstring<const_char> local_498;
  basic_cstring<const_char> local_488;
  lazy_ostream local_478 [2];
  undefined1 local_453;
  assertion_result local_450;
  basic_cstring<const_char> local_428;
  undefined8 local_418 [4];
  basic_cstring<const_char> local_3f8;
  basic_cstring<const_char> local_3e8;
  lazy_ostream local_3d8 [2];
  undefined1 local_3b3;
  assertion_result local_3b0;
  basic_cstring<const_char> local_388;
  basic_cstring<const_char> local_378;
  basic_cstring<const_char> local_368;
  lazy_ostream local_358 [2];
  undefined4 local_334;
  assertion_result local_318;
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  basic_cstring<const_char> local_2d0;
  lazy_ostream local_2c0 [2];
  undefined4 local_29c;
  assertion_result local_280;
  basic_cstring<const_char> local_258;
  basic_cstring<const_char> local_248;
  basic_cstring<const_char> local_238;
  lazy_ostream local_228 [2];
  undefined1 local_203;
  assertion_result local_200;
  basic_cstring<const_char> local_1d8;
  undefined1 local_1c2 [65];
  undefined1 local_181 [97];
  array<unsigned_char,_32UL> local_120;
  basic_cstring<const_char> local_100;
  basic_cstring<const_char> local_f0;
  lazy_ostream local_e0 [3];
  assertion_result local_b0;
  basic_cstring<const_char> local_88;
  undefined8 local_78;
  undefined8 local_60;
  context_frame local_14;
  undefined4 *local_10;
  
  local_10 = in_RSI;
  boost::unit_test::lazy_ostream::instance();
  boost::unit_test::operator<<
            ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
             (char (*) [16])in_stack_fffffffffffff860);
  local_60 = picnic_get_param_name(*local_10);
  boost::unit_test::operator<<
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
             &in_stack_fffffffffffff860->m_begin);
  boost::test_tools::tt_detail::context_frame::context_frame
            ((context_frame *)in_stack_fffffffffffff860,in_stack_fffffffffffff858);
  boost::unit_test::
  lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>,_const_char_*,_const_char_*const_&>
              *)0x1c175f);
  boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]>
  ::~lazy_ostream_impl
            ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[16],_const_char_(&)[16]> *)
             0x1c176c);
  bVar1 = boost::test_tools::tt_detail::context_frame::operator_cast_to_bool(&local_14);
  if (bVar1) {
    local_78 = picnic_signature_size(*local_10);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_88,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (unsigned_long *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::value_expr<const_unsigned_long_&>::evaluate
                (in_stack_fffffffffffff8e8,SUB81((ulong)in_stack_fffffffffffff8e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_f0,"max_signature_size",0x12);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_100,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_b0,local_e0,&local_100,0x1b,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c18eb);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c18f8);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    (anonymous_namespace)::randomize_container<std::array<unsigned_char,32ul>>(in_stack_00000c20);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_1d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      iVar2 = picnic_keygen(*local_10,local_1c2,local_181);
      local_203 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (bool *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffff8e8,
                 SUB81((ulong)in_stack_fffffffffffff8e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_238,"!picnic_keygen(param, &public_key, &private_key)",0x30);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_248,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_200,local_228,&local_248,0x23,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c1aa1);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c1aae);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_258,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      local_29c = picnic_get_public_key_param(local_1c2);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (anon_enum_32 *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<picnic_params_t>,picnic_params_t>::
      operator==((expression_base<boost::test_tools::assertion::value_expr<picnic_params_t>,_picnic_params_t>
                  *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (anon_enum_32 *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
                  *)in_stack_fffffffffffffa78,(bool)in_stack_fffffffffffffa77);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2d0,"picnic_get_public_key_param(&public_key) == param",0x31);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_280,local_2c0,&local_2e0,0x26,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c1c52);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c1c5f);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_2f0,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      local_334 = picnic_get_private_key_param(local_181);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (anon_enum_32 *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<picnic_params_t>,picnic_params_t>::
      operator==((expression_base<boost::test_tools::assertion::value_expr<picnic_params_t>,_picnic_params_t>
                  *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (anon_enum_32 *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<picnic_params_t>,_const_picnic_params_t_&,_boost::test_tools::assertion::op::EQ<picnic_params_t,_picnic_params_t,_void>_>
                  *)in_stack_fffffffffffffa78,(bool)in_stack_fffffffffffffa77);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_368,"picnic_get_private_key_param(&private_key) == param",0x33);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_378,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_318,local_358,&local_378,0x27,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c1e03);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c1e10);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_388,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      iVar2 = picnic_validate_keypair(local_181,local_1c2);
      local_3b3 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (bool *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                ((value_expr<bool> *)in_stack_fffffffffffff8e8,
                 SUB81((ulong)in_stack_fffffffffffff8e0 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3e8,"!picnic_validate_keypair(&private_key, &public_key)",0x33);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_3f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_3b0,local_3d8,&local_3f8,0x28,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c1fa0);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c1fad);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c1fe1);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffff880,in_stack_fffffffffffff878);
    local_418[0] = local_78;
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_428,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      this_04 = &local_120;
      this_00 = (value_expr<bool> *)
                std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x1c207a);
      sVar3 = std::array<unsigned_char,_32UL>::size(this_04);
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c20a4);
      iVar2 = picnic_sign(local_181,this_00,sVar3,puVar4,local_418);
      local_453 = iVar2 == 0;
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (bool *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                (this_00,SUB81((ulong)this_04 >> 0x38,0));
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_488,"!picnic_sign(&private_key, m.data(), m.size(), sig.data(), &siglen)",
                 0x43);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_498,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_450,local_478,&local_498,0x2f,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c21c9);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c21d6);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_4a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (in_stack_fffffffffffff8b0,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (unsigned_long *)in_stack_fffffffffffff860);
      local_4f0 = 0;
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
      operator>((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                 *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                (int *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
      ::evaluate((binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_int,_boost::test_tools::assertion::op::GT<unsigned_long,_int,_void>_>
                  *)in_stack_fffffffffffffa78,(bool)in_stack_fffffffffffffa77);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_520,"siglen > 0",10);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_530,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_4d0,local_510,&local_530,0x30,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c234f);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c235c);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      this_03 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_540,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this_03,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),
                 in_stack_fffffffffffff898);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (unsigned_long *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::
      expression_base<boost::test_tools::assertion::value_expr<unsigned_long&>,unsigned_long>::
      operator<=((expression_base<boost::test_tools::assertion::value_expr<unsigned_long_&>,_unsigned_long>
                  *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (unsigned_long *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::
      binary_expr<boost::test_tools::assertion::value_expr<unsigned_long_&>,_const_unsigned_long_&,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
      ::evaluate(in_stack_fffffffffffffa78,(bool)in_stack_fffffffffffffa77);
      in_stack_fffffffffffff8a8 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_5b8,"siglen <= max_signature_size",0x1c);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_5c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_568,&local_5a8,&local_5c8,0x31,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c24ca);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c24d7);
      in_stack_fffffffffffff8a7 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff8a7);
    do {
      msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_5d8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff860);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)this_03,(const_string *)in_stack_fffffffffffff8a8,
                 CONCAT17(in_stack_fffffffffffff8a7,in_stack_fffffffffffff8a0),msg);
      this_02 = &local_120;
      pvVar5 = std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x1c255b);
      sVar3 = std::array<unsigned_char,_32UL>::size(this_02);
      puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1c257c);
      picnic_verify(local_1c2,pvVar5,sVar3,puVar4,local_418[0]);
      boost::test_tools::assertion::seed::operator->*
                ((seed *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 (bool *)in_stack_fffffffffffff860);
      boost::test_tools::assertion::value_expr<bool>::evaluate
                (this_00,SUB81((ulong)this_04 >> 0x38,0));
      this_01 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffff9c8,
                 "!picnic_verify(&public_key, m.data(), m.size(), sig.data(), siglen)",0x43);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff86f,in_stack_fffffffffffff868),
                 in_stack_fffffffffffff860);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)&stack0xfffffffffffff9b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_test.cpp"
                 ,0x55);
      boost::test_tools::tt_detail::report_assertion
                (&local_600,(lazy_ostream *)&stack0xfffffffffffff9d8,
                 (const_string *)&stack0xfffffffffffff9b8,0x33,CHECK,CHECK_BUILT_ASSERTION,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1c268f);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1c269c);
      in_stack_fffffffffffff86f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffff86f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
  }
  boost::test_tools::tt_detail::context_frame::~context_frame((context_frame *)0x1c29e7);
  return;
}

Assistant:

BOOST_DATA_TEST_CASE(sign_verify, all_supported_parameters(), param) {
  BOOST_TEST_CONTEXT("Parameter set: " << picnic_get_param_name(param)) {
    const size_t max_signature_size = picnic_signature_size(param);
    BOOST_TEST(max_signature_size);

    std::array<uint8_t, 32> m;
    randomize_container(m);

    // Create a key pair
    picnic_privatekey_t private_key;
    picnic_publickey_t public_key;
    BOOST_TEST(!picnic_keygen(param, &public_key, &private_key));

    // Valid key pair
    BOOST_TEST(picnic_get_public_key_param(&public_key) == param);
    BOOST_TEST(picnic_get_private_key_param(&private_key) == param);
    BOOST_TEST(!picnic_validate_keypair(&private_key, &public_key));

    std::vector<uint8_t> sig;
    sig.resize(max_signature_size);
    size_t siglen = max_signature_size;

    // Sign a message
    BOOST_TEST(!picnic_sign(&private_key, m.data(), m.size(), sig.data(), &siglen));
    BOOST_TEST(siglen > 0);
    BOOST_TEST(siglen <= max_signature_size);
    // Verify signature
    BOOST_TEST(!picnic_verify(&public_key, m.data(), m.size(), sig.data(), siglen));
  }
}